

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O1

int Catch(Situation *situation,Movement *move)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint unaff_EBP;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int player;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  uint unaff_R13D;
  uint unaff_R14D;
  uint uVar16;
  
  bVar1 = move->to;
  uVar9 = (uint)situation->current_board[bVar1] + situation->current_player * -0x10;
  if (uVar9 < 0x1b) {
    player = 1 - situation->current_player;
    uVar16 = player * 0x10 + 0x10;
    if ((0x600000U >> (uVar9 & 0x1f) & 1) == 0) {
      uVar13 = bVar1 & 0xf;
      bVar2 = bVar1 >> 4;
      uVar11 = (uint)bVar1;
      if ((0x1800000U >> (uVar9 & 0x1f) & 1) == 0) {
        if ((0x6000000U >> (uVar9 & 0x1f) & 1) == 0) {
          return 0;
        }
        if (uVar13 == (move->from & 0xf)) {
          uVar4 = situation->bit_row[bVar2];
          lVar10 = 0;
          bVar15 = false;
          do {
            bVar1 = *(byte *)((ulong)((uVar11 & 0xf) << 0xc) + (ulong)uVar4 * 8 + 0x305d54 + lVar10)
            ;
            if (uVar13 == bVar1) {
LAB_00109124:
              bVar7 = true;
              uVar9 = unaff_R14D;
            }
            else {
              uVar12 = (ulong)bVar1 | (ulong)(uVar11 & 0xfffffff0);
              bVar2 = situation->current_board[uVar12];
              if ((uVar16 & bVar2) == 0) goto LAB_00109124;
              iVar8 = bVar2 - uVar16;
              uVar9 = (uint)bVar2;
              if (iVar8 == 0) {
LAB_001090db:
                bVar7 = false;
              }
              else {
                if (iVar8 < 9) {
                  if (1 < iVar8 - 5U) goto LAB_001090db;
                }
                else if ((iVar8 < 0xb) ||
                        ((((uint)bVar1 | uVar11 & 0xfffffff0) & 0xffffff80) != player * 0x80))
                goto LAB_00109124;
                bVar7 = false;
                bVar6 = IfProtected(player,(int)uVar12,situation,0);
                if (bVar6) goto LAB_00109124;
              }
            }
            unaff_R14D = uVar9;
            if (!bVar7) break;
            lVar10 = lVar10 + 1;
            bVar15 = lVar10 != 1;
          } while (lVar10 == 1);
        }
        else {
          uVar4 = situation->bit_col[uVar13];
          lVar10 = 0;
          bVar15 = false;
          do {
            bVar3 = *(byte *)((ulong)((bVar1 & 0xf0) << 9) + (ulong)uVar4 * 8 + 0x30bd54 + lVar10);
            if (bVar2 == bVar3) {
LAB_00109479:
              bVar7 = true;
              uVar14 = unaff_R13D;
            }
            else {
              uVar9 = (uint)bVar3 * 0x10;
              uVar11 = uVar9 + uVar13;
              bVar3 = situation->current_board[uVar11];
              if ((uVar16 & bVar3) == 0) goto LAB_00109479;
              iVar8 = bVar3 - uVar16;
              uVar14 = (uint)bVar3;
              if (iVar8 == 0) {
LAB_00109430:
                bVar7 = false;
              }
              else {
                if (iVar8 < 9) {
                  if (1 < iVar8 - 5U) goto LAB_00109430;
                }
                else if ((iVar8 < 0xb) || ((uVar9 & 0x80) != player * 0x80)) goto LAB_00109479;
                bVar7 = false;
                bVar6 = IfProtected(player,uVar11,situation,0);
                if (bVar6) goto LAB_00109479;
              }
            }
            unaff_R13D = uVar14;
            unaff_R14D = unaff_R13D;
            if (!bVar7) break;
            lVar10 = lVar10 + 1;
            bVar15 = lVar10 != 1;
          } while (lVar10 == 1);
        }
      }
      else if (uVar13 == (move->from & 0xf)) {
        uVar4 = situation->bit_row[bVar2];
        lVar10 = 0;
        bVar15 = false;
        do {
          bVar2 = *(byte *)((ulong)((bVar1 & 0xf) << 0xc) + (ulong)uVar4 * 8 + 0x305d52 + lVar10);
          if (uVar13 == bVar2) {
LAB_00109215:
            bVar7 = true;
            uVar14 = unaff_EBP;
          }
          else {
            uVar12 = (ulong)bVar2 | (ulong)(uVar11 & 0xfffffff0);
            bVar3 = situation->current_board[uVar12];
            uVar9 = (uint)bVar3;
            if ((uVar16 & uVar9) == 0) goto LAB_00109215;
            iVar8 = uVar9 - uVar16;
            uVar14 = (uint)bVar3;
            if (uVar9 != uVar16) {
              if (iVar8 < 8) {
                if (iVar8 != 7 && 4 < iVar8) {
LAB_001091ef:
                  bVar7 = false;
                  bVar6 = IfProtected(player,(int)uVar12,situation,0);
                  if (!bVar6) goto LAB_00109218;
                }
              }
              else if ((iVar8 < 0xb) ||
                      ((((uint)bVar2 | uVar11 & 0xfffffff0) & 0xffffff80) == player * 0x80))
              goto LAB_001091ef;
              goto LAB_00109215;
            }
            bVar7 = false;
          }
LAB_00109218:
          unaff_EBP = uVar14;
          unaff_R14D = unaff_EBP;
          if (!bVar7) break;
          lVar10 = lVar10 + 1;
          bVar15 = lVar10 != 1;
        } while (lVar10 == 1);
      }
      else {
        uVar4 = situation->bit_col[uVar13];
        lVar10 = 0;
        bVar15 = false;
        do {
          bVar3 = *(byte *)((ulong)((bVar1 & 0xf0) << 9) + (ulong)uVar4 * 8 + 0x30bd52 + lVar10);
          if (bVar2 == bVar3) {
LAB_001093a5:
            bVar7 = true;
            uVar5 = unaff_R13D;
          }
          else {
            uVar9 = (uint)bVar3 * 0x10;
            uVar11 = uVar9 + uVar13;
            bVar3 = situation->current_board[uVar11];
            uVar14 = (uint)bVar3;
            if ((uVar16 & uVar14) == 0) goto LAB_001093a5;
            iVar8 = uVar14 - uVar16;
            uVar5 = (uint)bVar3;
            if (uVar14 != uVar16) {
              if (iVar8 < 8) {
                if (iVar8 != 7 && 4 < iVar8) {
LAB_0010937f:
                  bVar7 = false;
                  bVar6 = IfProtected(player,uVar11,situation,0);
                  if (!bVar6) goto LAB_001093a8;
                }
              }
              else if ((iVar8 < 0xb) || ((uVar9 & 0x80) == player * 0x80)) goto LAB_0010937f;
              goto LAB_001093a5;
            }
            bVar7 = false;
          }
LAB_001093a8:
          unaff_R13D = uVar5;
          unaff_R14D = unaff_R13D;
          if (!bVar7) break;
          lVar10 = lVar10 + 1;
          bVar15 = lVar10 != 1;
        } while (lVar10 == 1);
      }
      if (!bVar15) {
        return unaff_R14D;
      }
    }
    else {
      uVar9 = HORSE_CAN_GET[bVar1][0];
      if (uVar9 != 0) {
        lVar10 = (ulong)((uint)bVar1 * 8) * 5;
        do {
          if (situation->current_board[*(int *)((long)HORSE_LEG[0] + lVar10)] == '\0') {
            uVar11 = (uint)situation->current_board[(int)uVar9];
            uVar13 = (uint)situation->current_board[(int)uVar9];
            if ((uVar16 & uVar13) != 0) {
              iVar8 = uVar13 - uVar16;
              if (uVar13 == uVar16) {
LAB_0010928f:
                bVar15 = false;
              }
              else {
                if (iVar8 < 9) {
                  if (iVar8 < 7) goto LAB_001092cd;
                  goto LAB_0010928f;
                }
                if ((iVar8 < 0xb) || ((uVar9 & 0x80) == player * 0x80)) {
                  bVar15 = false;
                  bVar7 = IfProtected(player,uVar9,situation,0);
                  if (bVar7) goto LAB_001092cd;
                }
                else {
LAB_001092cd:
                  bVar15 = true;
                  uVar11 = unaff_R14D;
                }
              }
              unaff_R14D = uVar11;
              if (!bVar15) {
                return uVar11;
              }
            }
          }
          uVar9 = *(uint *)((long)HORSE_CAN_GET[0] + lVar10 + 4);
          lVar10 = lVar10 + 4;
        } while (uVar9 != 0);
      }
    }
  }
  return 0;
}

Assistant:

int Catch(const Situation & situation, const Movement & move){
    int player_flag, opplayer_flag, from, to, from_id, catch_id, counter;
    player_flag = GetPlayerFlag(situation.current_player);
    opplayer_flag = GetPlayerFlag(OpponentPlayer(situation.current_player));
    from = move.to;
    from_id = situation.current_board[from];
    int horse_leg;
    int from_col = GetCol(from), from_row = GetRow(from);

    switch (from_id - player_flag){
    // 马抓子
    case 5:
    case 6:
        counter = 0;
        to = HORSE_CAN_GET[from][counter];
        while(to != 0){
            horse_leg = HORSE_LEG[from][counter];
            catch_id = situation.current_board[to];
            if(situation.current_board[horse_leg] == 0 && (catch_id & opplayer_flag) != 0){
                int catch_id_no = catch_id - opplayer_flag;
                if(catch_id_no == 0) return catch_id;
                if(catch_id_no <= 8){
                    if(catch_id_no >= 7) return catch_id;
                }
                else if(catch_id_no <= 10){
                    if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                }
                else{
                    if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                }
            }
            counter ++;
            to = HORSE_CAN_GET[from][counter];
        }
        break;
    // 车抓子
    case 7:
    case 8:
        // 纵向移动
        if(from_col == GetCol(move.from)){
            for(int i = 0; i < 2; i ++){
                int catch_col = ROOK_CANNON_CAN_GET_ROW[from_col - 3][situation.bit_row[from_row]].rook_capture[i];
                if(catch_col != from_col){
                    to = GetPosition(catch_col, from_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 7){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                        }
                        else if(catch_id_no <= 10){
                            if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                        else{
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        // 横向移动
        else{
            for(int i = 0;i < 2; i ++){
                int catch_row = ROOK_CANNON_CAN_GET_COL[from_row - 3][situation.bit_col[from_col]].rook_capture[i];
                if(catch_row != from_row){
                    to = GetPosition(from_col, catch_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 7){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                        }
                        else if(catch_id_no <= 10){
                            if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                        else{
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        break;
    // 炮抓子
    case 9:
    case 10:
        // 纵向移动
        if(from_col == GetCol(move.from)){
            for(int i = 0; i < 2; i ++){
                int catch_col = ROOK_CANNON_CAN_GET_ROW[from_col - 3][situation.bit_row[from_row]].cannon_capture[i];
                if(catch_col != from_col){
                    to = GetPosition(catch_col, from_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 8){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                            else return catch_id;
                        }
                        else if(catch_id_no >= 11){
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        // 横向移动
        else{
            for(int i = 0;i < 2; i ++){
                int catch_row = ROOK_CANNON_CAN_GET_COL[from_row - 3][situation.bit_col[from_col]].cannon_capture[i];
                if(catch_row != from_row){
                    to = GetPosition(from_col, catch_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 8){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                            else return catch_id;
                        }
                        else if(catch_id_no >= 11){
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        break;
    default:
        break;
    }
    return 0;
}